

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_packet_decoder.c
# Opt level: O0

int pt_pkt_decoder_init(pt_packet_decoder *decoder,pt_config *config)

{
  int errcode;
  pt_config *config_local;
  pt_packet_decoder *decoder_local;
  
  if ((decoder == (pt_packet_decoder *)0x0) || (config == (pt_config *)0x0)) {
    decoder_local._4_4_ = -2;
  }
  else {
    memset(decoder,0,0x128);
    decoder_local._4_4_ = pt_config_from_user(&decoder->config,config);
    if (-1 < decoder_local._4_4_) {
      decoder_local._4_4_ = 0;
    }
  }
  return decoder_local._4_4_;
}

Assistant:

int pt_pkt_decoder_init(struct pt_packet_decoder *decoder,
			const struct pt_config *config)
{
	int errcode;

	if (!decoder || !config)
		return -pte_invalid;

	memset(decoder, 0, sizeof(*decoder));

	errcode = pt_config_from_user(&decoder->config, config);
	if (errcode < 0)
		return errcode;

	return 0;
}